

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_generated.h
# Opt level: O1

bool __thiscall MyGame::Example::Monster::Verify(Monster *this,Verifier *verifier)

{
  bool bVar1;
  Monster MVar2;
  ushort uVar3;
  long lVar4;
  unsigned_short vtsize;
  String *str;
  Monster *pMVar5;
  Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *pVVar6;
  Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int> *vec;
  Vector<unsigned_char,_unsigned_int> *pVVar7;
  Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int> *pVVar8;
  Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int> *vec_00;
  Stat *this_00;
  
  bVar1 = flatbuffers::VerifierTemplate<false>::VerifyTableStart(verifier,(uint8_t *)this);
  if ((((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyField<MyGame::Example::Vec3>
                          (&this->super_Table,verifier,4,8), bVar1)) &&
      (bVar1 = flatbuffers::Table::VerifyField<short>(&this->super_Table,verifier,6,2), bVar1)) &&
     ((bVar1 = flatbuffers::Table::VerifyField<short>(&this->super_Table,verifier,8,2), bVar1 &&
      (bVar1 = flatbuffers::Table::VerifyOffsetRequired<unsigned_int>
                         (&this->super_Table,verifier,10), bVar1)))) {
    if (*(ushort *)(this + -(long)*(int *)this) < 0xb) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(this + (10 - (long)*(int *)this));
    }
    if (uVar3 == 0) {
      str = (String *)0x0;
    }
    else {
      str = (String *)(this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3);
    }
    bVar1 = flatbuffers::VerifierTemplate<false>::VerifyString(verifier,str);
    if ((bVar1) &&
       (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0xe),
       bVar1)) {
      if (*(ushort *)(this + -(long)*(int *)this) < 0xf) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)(this + (0xe - (long)*(int *)this));
      }
      if (uVar3 == 0) {
        pMVar5 = (Monster *)0x0;
      }
      else {
        pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
      }
      if ((pMVar5 != (Monster *)0x0) &&
         (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                            (verifier,(uint8_t *)pMVar5,1,(size_t *)0x0), !bVar1)) {
        return false;
      }
      lVar4 = -(long)*(int *)this;
      if (*(ushort *)(this + -(long)*(int *)this) < 0x11) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)(this + lVar4 + 0x10);
      }
      if (uVar3 != 0) {
        if (verifier->size_ < 2) {
          return false;
        }
        if ((Monster *)(verifier->size_ - 1) < this + ((ulong)uVar3 - (long)verifier->buf_)) {
          return false;
        }
      }
      if (*(ushort *)(this + -(long)*(int *)this) < 0x13) {
        uVar3 = 0;
      }
      else {
        uVar3 = *(ushort *)(this + lVar4 + 0x12);
      }
      if (uVar3 != 0) {
        if (verifier->size_ < 2) {
          return false;
        }
        if ((Monster *)(verifier->size_ - 1) < this + ((ulong)uVar3 - (long)verifier->buf_)) {
          return false;
        }
      }
      bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0x14);
      if (bVar1) {
        lVar4 = -(long)*(int *)this;
        if (*(ushort *)(this + -(long)*(int *)this) < 0x15) {
          uVar3 = 0;
        }
        else {
          uVar3 = *(ushort *)(this + lVar4 + 0x14);
        }
        if (uVar3 == 0) {
          pMVar5 = (Monster *)0x0;
        }
        else {
          pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
        }
        if (*(ushort *)(this + -(long)*(int *)this) < 0x13) {
          uVar3 = 0;
        }
        else {
          uVar3 = *(ushort *)(this + lVar4 + 0x12);
        }
        if (uVar3 == 0) {
          MVar2.super_Table = (Table)0x0;
        }
        else {
          MVar2.super_Table = this[uVar3].super_Table;
        }
        bVar1 = VerifyAny(verifier,pMVar5,(Any)MVar2.super_Table);
        if ((bVar1) &&
           (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0x16)
           , bVar1)) {
          if (*(ushort *)(this + -(long)*(int *)this) < 0x17) {
            uVar3 = 0;
          }
          else {
            uVar3 = *(ushort *)(this + (0x16 - (long)*(int *)this));
          }
          if (uVar3 == 0) {
            pMVar5 = (Monster *)0x0;
          }
          else {
            pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
          }
          if ((pMVar5 != (Monster *)0x0) &&
             (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                (verifier,(uint8_t *)pMVar5,4,(size_t *)0x0), !bVar1)) {
            return false;
          }
          bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>(&this->super_Table,verifier,0x18);
          if (bVar1) {
            if (*(ushort *)(this + -(long)*(int *)this) < 0x19) {
              uVar3 = 0;
            }
            else {
              uVar3 = *(ushort *)(this + (0x18 - (long)*(int *)this));
            }
            if (uVar3 == 0) {
              pMVar5 = (Monster *)0x0;
            }
            else {
              pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
            }
            if ((pMVar5 != (Monster *)0x0) &&
               (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                  (verifier,(uint8_t *)pMVar5,4,(size_t *)0x0), !bVar1)) {
              return false;
            }
            if (*(ushort *)(this + -(long)*(int *)this) < 0x19) {
              uVar3 = 0;
            }
            else {
              uVar3 = *(ushort *)(this + (0x18 - (long)*(int *)this));
            }
            if (uVar3 == 0) {
              pVVar6 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)0x0;
            }
            else {
              pVVar6 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int> *)
                       (this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3);
            }
            bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings(verifier,pVVar6);
            if ((bVar1) &&
               (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                  (&this->super_Table,verifier,0x1a), bVar1)) {
              if (*(ushort *)(this + -(long)*(int *)this) < 0x1b) {
                uVar3 = 0;
              }
              else {
                uVar3 = *(ushort *)(this + (0x1a - (long)*(int *)this));
              }
              if (uVar3 == 0) {
                pMVar5 = (Monster *)0x0;
              }
              else {
                pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
              }
              if ((pMVar5 != (Monster *)0x0) &&
                 (bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOrString<unsigned_int>
                                    (verifier,(uint8_t *)pMVar5,4,(size_t *)0x0), !bVar1)) {
                return false;
              }
              if (*(ushort *)(this + -(long)*(int *)this) < 0x1b) {
                uVar3 = 0;
              }
              else {
                uVar3 = *(ushort *)(this + (0x1a - (long)*(int *)this));
              }
              if (uVar3 == 0) {
                vec = (Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int> *)0x0;
              }
              else {
                vec = (Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int> *)
                      (this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3);
              }
              bVar1 = flatbuffers::VerifierTemplate<false>::
                      VerifyVectorOfTables<MyGame::Example::Monster>(verifier,vec);
              if ((bVar1) &&
                 (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                    (&this->super_Table,verifier,0x1c), bVar1)) {
                if (*(ushort *)(this + -(long)*(int *)this) < 0x1d) {
                  uVar3 = 0;
                }
                else {
                  uVar3 = *(ushort *)(this + (0x1c - (long)*(int *)this));
                }
                if (uVar3 == 0) {
                  pMVar5 = (Monster *)0x0;
                }
                else {
                  pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
                }
                if (((pMVar5 == (Monster *)0x0) || (bVar1 = Verify(pMVar5,verifier), bVar1)) &&
                   (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                      (&this->super_Table,verifier,0x1e), bVar1)) {
                  if (*(ushort *)(this + -(long)*(int *)this) < 0x1f) {
                    uVar3 = 0;
                  }
                  else {
                    uVar3 = *(ushort *)(this + (0x1e - (long)*(int *)this));
                  }
                  if (uVar3 == 0) {
                    pMVar5 = (Monster *)0x0;
                  }
                  else {
                    pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
                  }
                  if ((pMVar5 != (Monster *)0x0) &&
                     (bVar1 = flatbuffers::VerifierTemplate<false>::
                              VerifyVectorOrString<unsigned_int>
                                        (verifier,(uint8_t *)pMVar5,1,(size_t *)0x0), !bVar1)) {
                    return false;
                  }
                  if (*(ushort *)(this + -(long)*(int *)this) < 0x1f) {
                    uVar3 = 0;
                  }
                  else {
                    uVar3 = *(ushort *)(this + (0x1e - (long)*(int *)this));
                  }
                  if (uVar3 == 0) {
                    pVVar7 = (Vector<unsigned_char,_unsigned_int> *)0x0;
                  }
                  else {
                    pVVar7 = (Vector<unsigned_char,_unsigned_int> *)
                             (this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3);
                  }
                  bVar1 = flatbuffers::VerifierTemplate<false>::
                          VerifyNestedFlatBuffer<MyGame::Example::Monster,_unsigned_int>
                                    (verifier,pVVar7,(char *)0x0);
                  if (!bVar1) {
                    return false;
                  }
                  bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                    (&this->super_Table,verifier,0x20);
                  if (bVar1) {
                    if (*(ushort *)(this + -(long)*(int *)this) < 0x21) {
                      uVar3 = 0;
                    }
                    else {
                      uVar3 = *(ushort *)(this + (0x20 - (long)*(int *)this));
                    }
                    if (uVar3 == 0) {
                      this_00 = (Stat *)0x0;
                    }
                    else {
                      this_00 = (Stat *)(this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3);
                    }
                    if ((this_00 == (Stat *)0x0) || (bVar1 = Stat::Verify(this_00,verifier), bVar1))
                    {
                      if (*(ushort *)(this + -(long)*(int *)this) < 0x23) {
                        uVar3 = 0;
                      }
                      else {
                        uVar3 = *(ushort *)(this + (0x22 - (long)*(int *)this));
                      }
                      if (uVar3 != 0) {
                        if (verifier->size_ < 2) {
                          return false;
                        }
                        if ((Monster *)(verifier->size_ - 1) <
                            this + ((ulong)uVar3 - (long)verifier->buf_)) {
                          return false;
                        }
                      }
                      bVar1 = flatbuffers::Table::VerifyField<int>
                                        (&this->super_Table,verifier,0x24,4);
                      if ((((((bVar1) &&
                             (bVar1 = flatbuffers::Table::VerifyField<unsigned_int>
                                                (&this->super_Table,verifier,0x26,4), bVar1)) &&
                            (bVar1 = flatbuffers::Table::VerifyField<long>
                                               (&this->super_Table,verifier,0x28,8), bVar1)) &&
                           ((bVar1 = flatbuffers::Table::VerifyField<unsigned_long>
                                               (&this->super_Table,verifier,0x2a,8), bVar1 &&
                            (bVar1 = flatbuffers::Table::VerifyField<int>
                                               (&this->super_Table,verifier,0x2c,4), bVar1)))) &&
                          ((bVar1 = flatbuffers::Table::VerifyField<unsigned_int>
                                              (&this->super_Table,verifier,0x2e,4), bVar1 &&
                           ((bVar1 = flatbuffers::Table::VerifyField<long>
                                               (&this->super_Table,verifier,0x30,8), bVar1 &&
                            (bVar1 = flatbuffers::Table::VerifyField<unsigned_long>
                                               (&this->super_Table,verifier,0x32,8), bVar1)))))) &&
                         (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                            (&this->super_Table,verifier,0x34), bVar1)) {
                        if (*(ushort *)(this + -(long)*(int *)this) < 0x35) {
                          uVar3 = 0;
                        }
                        else {
                          uVar3 = *(ushort *)(this + (0x34 - (long)*(int *)this));
                        }
                        if (uVar3 == 0) {
                          pMVar5 = (Monster *)0x0;
                        }
                        else {
                          pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
                        }
                        if ((pMVar5 != (Monster *)0x0) &&
                           (bVar1 = flatbuffers::VerifierTemplate<false>::
                                    VerifyVectorOrString<unsigned_int>
                                              (verifier,(uint8_t *)pMVar5,1,(size_t *)0x0), !bVar1))
                        {
                          return false;
                        }
                        bVar1 = flatbuffers::Table::VerifyField<float>
                                          (&this->super_Table,verifier,0x36,4);
                        if ((((bVar1) &&
                             (bVar1 = flatbuffers::Table::VerifyField<float>
                                                (&this->super_Table,verifier,0x38,4), bVar1)) &&
                            (bVar1 = flatbuffers::Table::VerifyField<float>
                                               (&this->super_Table,verifier,0x3a,4), bVar1)) &&
                           (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                              (&this->super_Table,verifier,0x3c), bVar1)) {
                          if (*(ushort *)(this + -(long)*(int *)this) < 0x3d) {
                            uVar3 = 0;
                          }
                          else {
                            uVar3 = *(ushort *)(this + (0x3c - (long)*(int *)this));
                          }
                          if (uVar3 == 0) {
                            pMVar5 = (Monster *)0x0;
                          }
                          else {
                            pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
                          }
                          if ((pMVar5 != (Monster *)0x0) &&
                             (bVar1 = flatbuffers::VerifierTemplate<false>::
                                      VerifyVectorOrString<unsigned_int>
                                                (verifier,(uint8_t *)pMVar5,4,(size_t *)0x0), !bVar1
                             )) {
                            return false;
                          }
                          if (*(ushort *)(this + -(long)*(int *)this) < 0x3d) {
                            uVar3 = 0;
                          }
                          else {
                            uVar3 = *(ushort *)(this + (0x3c - (long)*(int *)this));
                          }
                          if (uVar3 == 0) {
                            pVVar6 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>
                                      *)0x0;
                          }
                          else {
                            pVVar6 = (Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>
                                      *)(this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3);
                          }
                          bVar1 = flatbuffers::VerifierTemplate<false>::VerifyVectorOfStrings
                                            (verifier,pVVar6);
                          if ((bVar1) &&
                             (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                (&this->super_Table,verifier,0x3e), bVar1)) {
                            if (*(ushort *)(this + -(long)*(int *)this) < 0x3f) {
                              uVar3 = 0;
                            }
                            else {
                              uVar3 = *(ushort *)(this + (0x3e - (long)*(int *)this));
                            }
                            if (uVar3 == 0) {
                              pMVar5 = (Monster *)0x0;
                            }
                            else {
                              pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
                            }
                            if ((pMVar5 != (Monster *)0x0) &&
                               (bVar1 = flatbuffers::VerifierTemplate<false>::
                                        VerifyVectorOrString<unsigned_int>
                                                  (verifier,(uint8_t *)pMVar5,8,(size_t *)0x0),
                               !bVar1)) {
                              return false;
                            }
                            bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                              (&this->super_Table,verifier,0x40);
                            if (bVar1) {
                              if (*(ushort *)(this + -(long)*(int *)this) < 0x41) {
                                uVar3 = 0;
                              }
                              else {
                                uVar3 = *(ushort *)(this + (0x40 - (long)*(int *)this));
                              }
                              if (uVar3 == 0) {
                                pMVar5 = (Monster *)0x0;
                              }
                              else {
                                pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
                              }
                              if ((pMVar5 != (Monster *)0x0) &&
                                 (bVar1 = flatbuffers::VerifierTemplate<false>::
                                          VerifyVectorOrString<unsigned_int>
                                                    (verifier,(uint8_t *)pMVar5,1,(size_t *)0x0),
                                 !bVar1)) {
                                return false;
                              }
                              if (*(ushort *)(this + -(long)*(int *)this) < 0x41) {
                                uVar3 = 0;
                              }
                              else {
                                uVar3 = *(ushort *)(this + (0x40 - (long)*(int *)this));
                              }
                              if (uVar3 == 0) {
                                pVVar7 = (Vector<unsigned_char,_unsigned_int> *)0x0;
                              }
                              else {
                                pVVar7 = (Vector<unsigned_char,_unsigned_int> *)
                                         (this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3);
                              }
                              bVar1 = flexbuffers::VerifyNestedFlexBuffer(pVVar7,verifier);
                              if ((bVar1) &&
                                 (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                    (&this->super_Table,verifier,0x42), bVar1)) {
                                if (*(ushort *)(this + -(long)*(int *)this) < 0x43) {
                                  uVar3 = 0;
                                }
                                else {
                                  uVar3 = *(ushort *)(this + (0x42 - (long)*(int *)this));
                                }
                                if (uVar3 == 0) {
                                  pMVar5 = (Monster *)0x0;
                                }
                                else {
                                  pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
                                }
                                if ((pMVar5 != (Monster *)0x0) &&
                                   (bVar1 = flatbuffers::VerifierTemplate<false>::
                                            VerifyVectorOrString<unsigned_int>
                                                      (verifier,(uint8_t *)pMVar5,4,(size_t *)0x0),
                                   !bVar1)) {
                                  return false;
                                }
                                bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                  (&this->super_Table,verifier,0x44);
                                if (bVar1) {
                                  if (*(ushort *)(this + -(long)*(int *)this) < 0x45) {
                                    uVar3 = 0;
                                  }
                                  else {
                                    uVar3 = *(ushort *)(this + (0x44 - (long)*(int *)this));
                                  }
                                  if (uVar3 == 0) {
                                    pMVar5 = (Monster *)0x0;
                                  }
                                  else {
                                    pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
                                  }
                                  if ((pMVar5 != (Monster *)0x0) &&
                                     (bVar1 = flatbuffers::VerifierTemplate<false>::
                                              VerifyVectorOrString<unsigned_int>
                                                        (verifier,(uint8_t *)pMVar5,8,(size_t *)0x0)
                                     , !bVar1)) {
                                    return false;
                                  }
                                  bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                    (&this->super_Table,verifier,0x46);
                                  if (bVar1) {
                                    if (*(ushort *)(this + -(long)*(int *)this) < 0x47) {
                                      uVar3 = 0;
                                    }
                                    else {
                                      uVar3 = *(ushort *)(this + (0x46 - (long)*(int *)this));
                                    }
                                    if (uVar3 == 0) {
                                      pMVar5 = (Monster *)0x0;
                                    }
                                    else {
                                      pMVar5 = this + (ulong)*(uint *)(this + uVar3) + (ulong)uVar3;
                                    }
                                    if ((pMVar5 != (Monster *)0x0) &&
                                       (bVar1 = flatbuffers::VerifierTemplate<false>::
                                                VerifyVectorOrString<unsigned_int>
                                                          (verifier,(uint8_t *)pMVar5,8,
                                                           (size_t *)0x0), !bVar1)) {
                                      return false;
                                    }
                                    bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                      (&this->super_Table,verifier,0x48);
                                    if (bVar1) {
                                      if (*(ushort *)(this + -(long)*(int *)this) < 0x49) {
                                        uVar3 = 0;
                                      }
                                      else {
                                        uVar3 = *(ushort *)(this + (0x48 - (long)*(int *)this));
                                      }
                                      if (uVar3 == 0) {
                                        pMVar5 = (Monster *)0x0;
                                      }
                                      else {
                                        pMVar5 = this + (ulong)*(uint *)(this + uVar3) +
                                                        (ulong)uVar3;
                                      }
                                      if (pMVar5 != (Monster *)0x0) {
                                        bVar1 = flatbuffers::VerifierTemplate<false>::
                                                VerifyTableStart(verifier,(uint8_t *)pMVar5);
                                        if (!bVar1) {
                                          return false;
                                        }
                                        verifier->depth_ = verifier->depth_ - 1;
                                      }
                                      bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                        (&this->super_Table,verifier,0x4a);
                                      if (bVar1) {
                                        if (*(ushort *)(this + -(long)*(int *)this) < 0x4b) {
                                          uVar3 = 0;
                                        }
                                        else {
                                          uVar3 = *(ushort *)(this + (0x4a - (long)*(int *)this));
                                        }
                                        if (uVar3 == 0) {
                                          pMVar5 = (Monster *)0x0;
                                        }
                                        else {
                                          pMVar5 = this + (ulong)*(uint *)(this + uVar3) +
                                                          (ulong)uVar3;
                                        }
                                        if ((pMVar5 != (Monster *)0x0) &&
                                           (bVar1 = flatbuffers::VerifierTemplate<false>::
                                                    VerifyVectorOrString<unsigned_int>
                                                              (verifier,(uint8_t *)pMVar5,4,
                                                               (size_t *)0x0), !bVar1)) {
                                          return false;
                                        }
                                        if (*(ushort *)(this + -(long)*(int *)this) < 0x4b) {
                                          uVar3 = 0;
                                        }
                                        else {
                                          uVar3 = *(ushort *)(this + (0x4a - (long)*(int *)this));
                                        }
                                        if (uVar3 == 0) {
                                          pVVar8 = (
                                                  Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>
                                                  *)0x0;
                                        }
                                        else {
                                          pVVar8 = (
                                                  Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>
                                                  *)(this + (ulong)*(uint *)(this + uVar3) +
                                                            (ulong)uVar3);
                                        }
                                        bVar1 = flatbuffers::VerifierTemplate<false>::
                                                VerifyVectorOfTables<MyGame::Example::Referrable>
                                                          (verifier,pVVar8);
                                        if (((bVar1) &&
                                            (bVar1 = flatbuffers::Table::VerifyField<unsigned_long>
                                                               (&this->super_Table,verifier,0x4c,8),
                                            bVar1)) &&
                                           (bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                              (&this->super_Table,verifier,0x4e),
                                           bVar1)) {
                                          if (*(ushort *)(this + -(long)*(int *)this) < 0x4f) {
                                            uVar3 = 0;
                                          }
                                          else {
                                            uVar3 = *(ushort *)(this + (0x4e - (long)*(int *)this));
                                          }
                                          if (uVar3 == 0) {
                                            pMVar5 = (Monster *)0x0;
                                          }
                                          else {
                                            pMVar5 = this + (ulong)*(uint *)(this + uVar3) +
                                                            (ulong)uVar3;
                                          }
                                          if ((pMVar5 != (Monster *)0x0) &&
                                             (bVar1 = flatbuffers::VerifierTemplate<false>::
                                                      VerifyVectorOrString<unsigned_int>
                                                                (verifier,(uint8_t *)pMVar5,8,
                                                                 (size_t *)0x0), !bVar1)) {
                                            return false;
                                          }
                                          bVar1 = flatbuffers::Table::VerifyOffset<unsigned_int>
                                                            (&this->super_Table,verifier,0x50);
                                          if (bVar1) {
                                            if (*(ushort *)(this + -(long)*(int *)this) < 0x51) {
                                              uVar3 = 0;
                                            }
                                            else {
                                              uVar3 = *(ushort *)
                                                       (this + (0x50 - (long)*(int *)this));
                                            }
                                            if (uVar3 == 0) {
                                              pMVar5 = (Monster *)0x0;
                                            }
                                            else {
                                              pMVar5 = this + (ulong)*(uint *)(this + uVar3) +
                                                              (ulong)uVar3;
                                            }
                                            if ((pMVar5 != (Monster *)0x0) &&
                                               (bVar1 = flatbuffers::VerifierTemplate<false>::
                                                        VerifyVectorOrString<unsigned_int>
                                                                  (verifier,(uint8_t *)pMVar5,4,
                                                                   (size_t *)0x0), !bVar1)) {
                                              return false;
                                            }
                                            if (*(ushort *)(this + -(long)*(int *)this) < 0x51) {
                                              uVar3 = 0;
                                            }
                                            else {
                                              uVar3 = *(ushort *)
                                                       (this + (0x50 - (long)*(int *)this));
                                            }
                                            if (uVar3 == 0) {
                                              pVVar8 = (
                                                  Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>
                                                  *)0x0;
                                            }
                                            else {
                                              pVVar8 = (
                                                  Vector<flatbuffers::Offset<MyGame::Example::Referrable>,_unsigned_int>
                                                  *)(this + (ulong)*(uint *)(this + uVar3) +
                                                            (ulong)uVar3);
                                            }
                                            bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                        
                                                  VerifyVectorOfTables<MyGame::Example::Referrable>
                                                            (verifier,pVVar8);
                                            if (((bVar1) &&
                                                (bVar1 = flatbuffers::Table::
                                                         VerifyField<unsigned_long>
                                                                   (&this->super_Table,verifier,0x52
                                                                    ,8), bVar1)) &&
                                               (bVar1 = flatbuffers::Table::
                                                        VerifyOffset<unsigned_int>
                                                                  (&this->super_Table,verifier,0x54)
                                               , bVar1)) {
                                              if (*(ushort *)(this + -(long)*(int *)this) < 0x55) {
                                                uVar3 = 0;
                                              }
                                              else {
                                                uVar3 = *(ushort *)
                                                         (this + (0x54 - (long)*(int *)this));
                                              }
                                              if (uVar3 == 0) {
                                                pMVar5 = (Monster *)0x0;
                                              }
                                              else {
                                                pMVar5 = this + (ulong)*(uint *)(this + uVar3) +
                                                                (ulong)uVar3;
                                              }
                                              if ((pMVar5 != (Monster *)0x0) &&
                                                 (bVar1 = flatbuffers::VerifierTemplate<false>::
                                                          VerifyVectorOrString<unsigned_int>
                                                                    (verifier,(uint8_t *)pMVar5,8,
                                                                     (size_t *)0x0), !bVar1)) {
                                                return false;
                                              }
                                              bVar1 = flatbuffers::Table::VerifyField<unsigned_long>
                                                                (&this->super_Table,verifier,0x56,8)
                                              ;
                                              if ((bVar1) &&
                                                 (bVar1 = flatbuffers::Table::
                                                          VerifyOffset<unsigned_int>
                                                                    (&this->super_Table,verifier,
                                                                     0x58), bVar1)) {
                                                if (*(ushort *)(this + -(long)*(int *)this) < 0x59)
                                                {
                                                  uVar3 = 0;
                                                }
                                                else {
                                                  uVar3 = *(ushort *)
                                                           (this + (0x58 - (long)*(int *)this));
                                                }
                                                if (uVar3 == 0) {
                                                  pMVar5 = (Monster *)0x0;
                                                }
                                                else {
                                                  pMVar5 = this + (ulong)*(uint *)(this + uVar3) +
                                                                  (ulong)uVar3;
                                                }
                                                if ((pMVar5 != (Monster *)0x0) &&
                                                   (bVar1 = flatbuffers::VerifierTemplate<false>::
                                                            VerifyVectorOrString<unsigned_int>
                                                                      (verifier,(uint8_t *)pMVar5,8,
                                                                       (size_t *)0x0), !bVar1)) {
                                                  return false;
                                                }
                                                if (*(ushort *)(this + -(long)*(int *)this) < 0x5b)
                                                {
                                                  uVar3 = 0;
                                                }
                                                else {
                                                  uVar3 = *(ushort *)
                                                           (this + (0x5a - (long)*(int *)this));
                                                }
                                                if (uVar3 != 0) {
                                                  if (verifier->size_ < 2) {
                                                    return false;
                                                  }
                                                  if ((Monster *)(verifier->size_ - 1) <
                                                      this + ((ulong)uVar3 - (long)verifier->buf_))
                                                  {
                                                    return false;
                                                  }
                                                }
                                                bVar1 = flatbuffers::Table::
                                                        VerifyOffset<unsigned_int>
                                                                  (&this->super_Table,verifier,0x5c)
                                                ;
                                                if (bVar1) {
                                                  lVar4 = -(long)*(int *)this;
                                                  if (*(ushort *)(this + -(long)*(int *)this) < 0x5d
                                                     ) {
                                                    uVar3 = 0;
                                                  }
                                                  else {
                                                    uVar3 = *(ushort *)(this + lVar4 + 0x5c);
                                                  }
                                                  if (uVar3 == 0) {
                                                    pMVar5 = (Monster *)0x0;
                                                  }
                                                  else {
                                                    pMVar5 = this + (ulong)*(uint *)(this + uVar3) +
                                                                    (ulong)uVar3;
                                                  }
                                                  if (*(ushort *)(this + -(long)*(int *)this) < 0x5b
                                                     ) {
                                                    uVar3 = 0;
                                                  }
                                                  else {
                                                    uVar3 = *(ushort *)(this + lVar4 + 0x5a);
                                                  }
                                                  if (uVar3 == 0) {
                                                    MVar2.super_Table = (Table)0x0;
                                                  }
                                                  else {
                                                    MVar2.super_Table = this[uVar3].super_Table;
                                                  }
                                                  bVar1 = VerifyAnyUniqueAliases
                                                                    (verifier,pMVar5,
                                                                     (AnyUniqueAliases)
                                                                     MVar2.super_Table);
                                                  if (bVar1) {
                                                    if (*(ushort *)(this + -(long)*(int *)this) <
                                                        0x5f) {
                                                      uVar3 = 0;
                                                    }
                                                    else {
                                                      uVar3 = *(ushort *)
                                                               (this + (0x5e - (long)*(int *)this));
                                                    }
                                                    if (uVar3 != 0) {
                                                      if (verifier->size_ < 2) {
                                                        return false;
                                                      }
                                                      if ((Monster *)(verifier->size_ - 1) <
                                                          this + ((ulong)uVar3 -
                                                                 (long)verifier->buf_)) {
                                                        return false;
                                                      }
                                                    }
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyOffset<unsigned_int>
                                                                      (&this->super_Table,verifier,
                                                                       0x60);
                                                    if (bVar1) {
                                                      lVar4 = -(long)*(int *)this;
                                                      if (*(ushort *)(this + -(long)*(int *)this) <
                                                          0x61) {
                                                        uVar3 = 0;
                                                      }
                                                      else {
                                                        uVar3 = *(ushort *)(this + lVar4 + 0x60);
                                                      }
                                                      if (uVar3 == 0) {
                                                        pMVar5 = (Monster *)0x0;
                                                      }
                                                      else {
                                                        pMVar5 = this + (ulong)*(uint *)(this + 
                                                  uVar3) + (ulong)uVar3;
                                                  }
                                                  if (*(ushort *)(this + -(long)*(int *)this) < 0x5f
                                                     ) {
                                                    uVar3 = 0;
                                                  }
                                                  else {
                                                    uVar3 = *(ushort *)(this + lVar4 + 0x5e);
                                                  }
                                                  if (uVar3 == 0) {
                                                    MVar2.super_Table = (Table)0x0;
                                                  }
                                                  else {
                                                    MVar2.super_Table = this[uVar3].super_Table;
                                                  }
                                                  bVar1 = VerifyAnyAmbiguousAliases
                                                                    (verifier,pMVar5,
                                                                     (AnyAmbiguousAliases)
                                                                     MVar2.super_Table);
                                                  if ((bVar1) &&
                                                     (bVar1 = flatbuffers::Table::
                                                              VerifyOffset<unsigned_int>
                                                                        (&this->super_Table,verifier
                                                                         ,0x62), bVar1)) {
                                                    if (*(ushort *)(this + -(long)*(int *)this) < 99
                                                       ) {
                                                      uVar3 = 0;
                                                    }
                                                    else {
                                                      uVar3 = *(ushort *)
                                                               (this + (0x62 - (long)*(int *)this));
                                                    }
                                                    if (uVar3 == 0) {
                                                      pMVar5 = (Monster *)0x0;
                                                    }
                                                    else {
                                                      pMVar5 = this + (ulong)*(uint *)(this + uVar3)
                                                                      + (ulong)uVar3;
                                                    }
                                                    if ((pMVar5 != (Monster *)0x0) &&
                                                       (bVar1 = flatbuffers::VerifierTemplate<false>
                                                                ::VerifyVectorOrString<unsigned_int>
                                                                          (verifier,(uint8_t *)
                                                                                    pMVar5,1,
                                                                           (size_t *)0x0), !bVar1))
                                                    {
                                                      return false;
                                                    }
                                                    if (*(ushort *)(this + -(long)*(int *)this) <
                                                        0x65) {
                                                      uVar3 = 0;
                                                    }
                                                    else {
                                                      uVar3 = *(ushort *)
                                                               (this + (100 - (long)*(int *)this));
                                                    }
                                                    if (uVar3 != 0) {
                                                      if (verifier->size_ < 2) {
                                                        return false;
                                                      }
                                                      if ((Monster *)(verifier->size_ - 1) <
                                                          this + ((ulong)uVar3 -
                                                                 (long)verifier->buf_)) {
                                                        return false;
                                                      }
                                                    }
                                                    bVar1 = flatbuffers::Table::
                                                            VerifyOffset<unsigned_int>
                                                                      (&this->super_Table,verifier,
                                                                       0x66);
                                                    if (bVar1) {
                                                      if (*(ushort *)(this + -(long)*(int *)this) <
                                                          0x67) {
                                                        uVar3 = 0;
                                                      }
                                                      else {
                                                        uVar3 = *(ushort *)
                                                                 (this + (0x66 - (long)*(int *)this)
                                                                 );
                                                      }
                                                      if (uVar3 == 0) {
                                                        pMVar5 = (Monster *)0x0;
                                                      }
                                                      else {
                                                        pMVar5 = this + (ulong)*(uint *)(this + 
                                                  uVar3) + (ulong)uVar3;
                                                  }
                                                  if ((pMVar5 != (Monster *)0x0) &&
                                                     (bVar1 = flatbuffers::VerifierTemplate<false>::
                                                              VerifyVectorOrString<unsigned_int>
                                                                        (verifier,(uint8_t *)pMVar5,
                                                                         1,(size_t *)0x0), !bVar1))
                                                  {
                                                    return false;
                                                  }
                                                  if (*(ushort *)(this + -(long)*(int *)this) < 0x67
                                                     ) {
                                                    uVar3 = 0;
                                                  }
                                                  else {
                                                    uVar3 = *(ushort *)
                                                             (this + (0x66 - (long)*(int *)this));
                                                  }
                                                  if (uVar3 == 0) {
                                                    pVVar7 = (Vector<unsigned_char,_unsigned_int> *)
                                                             0x0;
                                                  }
                                                  else {
                                                    pVVar7 = (Vector<unsigned_char,_unsigned_int> *)
                                                             (this + (ulong)*(uint *)(this + uVar3)
                                                                     + (ulong)uVar3);
                                                  }
                                                  bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                    
                                                  VerifyNestedFlatBuffer<MyGame::Example::Monster,_unsigned_int>
                                                            (verifier,pVVar7,(char *)0x0);
                                                  if (!bVar1) {
                                                    return false;
                                                  }
                                                  bVar1 = flatbuffers::Table::
                                                          VerifyOffset<unsigned_int>
                                                                    (&this->super_Table,verifier,
                                                                     0x68);
                                                  if (bVar1) {
                                                    if (*(ushort *)(this + -(long)*(int *)this) <
                                                        0x69) {
                                                      uVar3 = 0;
                                                    }
                                                    else {
                                                      uVar3 = *(ushort *)
                                                               (this + (0x68 - (long)*(int *)this));
                                                    }
                                                    if (uVar3 == 0) {
                                                      pMVar5 = (Monster *)0x0;
                                                    }
                                                    else {
                                                      pMVar5 = this + (ulong)*(uint *)(this + uVar3)
                                                                      + (ulong)uVar3;
                                                    }
                                                    if ((pMVar5 != (Monster *)0x0) &&
                                                       (bVar1 = flatbuffers::VerifierTemplate<false>
                                                                ::VerifyVectorOrString<unsigned_int>
                                                                          (verifier,(uint8_t *)
                                                                                    pMVar5,4,
                                                                           (size_t *)0x0), !bVar1))
                                                    {
                                                      return false;
                                                    }
                                                    if (*(ushort *)(this + -(long)*(int *)this) <
                                                        0x69) {
                                                      uVar3 = 0;
                                                    }
                                                    else {
                                                      uVar3 = *(ushort *)
                                                               (this + (0x68 - (long)*(int *)this));
                                                    }
                                                    if (uVar3 == 0) {
                                                      vec_00 = (
                                                  Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>
                                                  *)0x0;
                                                  }
                                                  else {
                                                    vec_00 = (
                                                  Vector<flatbuffers::Offset<MyGame::Example::Stat>,_unsigned_int>
                                                  *)(this + (ulong)*(uint *)(this + uVar3) +
                                                            (ulong)uVar3);
                                                  }
                                                  bVar1 = flatbuffers::VerifierTemplate<false>::
                                                                                                                    
                                                  VerifyVectorOfTables<MyGame::Example::Stat>
                                                            (verifier,vec_00);
                                                  if ((((((bVar1) &&
                                                         (bVar1 = flatbuffers::Table::
                                                                  VerifyField<MyGame::Example::Test>
                                                                            (&this->super_Table,
                                                                             verifier,0x6a,2), bVar1
                                                         )) && (bVar1 = flatbuffers::Table::
                                                                        VerifyField<unsigned_long>
                                                                                  (&this->
                                                  super_Table,verifier,0x6c,8), bVar1)) &&
                                                  ((bVar1 = flatbuffers::Table::
                                                            VerifyField<unsigned_long>
                                                                      (&this->super_Table,verifier,
                                                                       0x6e,8), bVar1 &&
                                                   (bVar1 = flatbuffers::Table::VerifyField<float>
                                                                      (&this->super_Table,verifier,
                                                                       0x70,4), bVar1)))) &&
                                                  (bVar1 = flatbuffers::Table::VerifyField<float>
                                                                     (&this->super_Table,verifier,
                                                                      0x72,4), bVar1)) &&
                                                  (((bVar1 = flatbuffers::Table::VerifyField<float>
                                                                       (&this->super_Table,verifier,
                                                                        0x74,4), bVar1 &&
                                                    (bVar1 = flatbuffers::Table::VerifyField<float>
                                                                       (&this->super_Table,verifier,
                                                                        0x76,4), bVar1)) &&
                                                   ((bVar1 = flatbuffers::Table::VerifyField<float>
                                                                       (&this->super_Table,verifier,
                                                                        0x78,4), bVar1 &&
                                                    (((bVar1 = flatbuffers::Table::
                                                               VerifyField<float>(&this->super_Table
                                                                                  ,verifier,0x7a,4),
                                                      bVar1 && (bVar1 = flatbuffers::Table::
                                                                        VerifyField<float>(&this->
                                                  super_Table,verifier,0x7c,4), bVar1)) &&
                                                  (bVar1 = flatbuffers::Table::VerifyField<double>
                                                                     (&this->super_Table,verifier,
                                                                      0x7e,8), bVar1)))))))) {
                                                    verifier->depth_ = verifier->depth_ - 1;
                                                    return true;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Verify(::flatbuffers::Verifier &verifier) const {
    return VerifyTableStart(verifier) &&
           VerifyField<MyGame::Example::Vec3>(verifier, VT_POS, 8) &&
           VerifyField<int16_t>(verifier, VT_MANA, 2) &&
           VerifyField<int16_t>(verifier, VT_HP, 2) &&
           VerifyOffsetRequired(verifier, VT_NAME) &&
           verifier.VerifyString(name()) &&
           VerifyOffset(verifier, VT_INVENTORY) &&
           verifier.VerifyVector(inventory()) &&
           VerifyField<uint8_t>(verifier, VT_COLOR, 1) &&
           VerifyField<uint8_t>(verifier, VT_TEST_TYPE, 1) &&
           VerifyOffset(verifier, VT_TEST) &&
           VerifyAny(verifier, test(), test_type()) &&
           VerifyOffset(verifier, VT_TEST4) &&
           verifier.VerifyVector(test4()) &&
           VerifyOffset(verifier, VT_TESTARRAYOFSTRING) &&
           verifier.VerifyVector(testarrayofstring()) &&
           verifier.VerifyVectorOfStrings(testarrayofstring()) &&
           VerifyOffset(verifier, VT_TESTARRAYOFTABLES) &&
           verifier.VerifyVector(testarrayoftables()) &&
           verifier.VerifyVectorOfTables(testarrayoftables()) &&
           VerifyOffset(verifier, VT_ENEMY) &&
           verifier.VerifyTable(enemy()) &&
           VerifyOffset(verifier, VT_TESTNESTEDFLATBUFFER) &&
           verifier.VerifyVector(testnestedflatbuffer()) &&
           verifier.VerifyNestedFlatBuffer<MyGame::Example::Monster>(testnestedflatbuffer(), nullptr) &&
           VerifyOffset(verifier, VT_TESTEMPTY) &&
           verifier.VerifyTable(testempty()) &&
           VerifyField<uint8_t>(verifier, VT_TESTBOOL, 1) &&
           VerifyField<int32_t>(verifier, VT_TESTHASHS32_FNV1, 4) &&
           VerifyField<uint32_t>(verifier, VT_TESTHASHU32_FNV1, 4) &&
           VerifyField<int64_t>(verifier, VT_TESTHASHS64_FNV1, 8) &&
           VerifyField<uint64_t>(verifier, VT_TESTHASHU64_FNV1, 8) &&
           VerifyField<int32_t>(verifier, VT_TESTHASHS32_FNV1A, 4) &&
           VerifyField<uint32_t>(verifier, VT_TESTHASHU32_FNV1A, 4) &&
           VerifyField<int64_t>(verifier, VT_TESTHASHS64_FNV1A, 8) &&
           VerifyField<uint64_t>(verifier, VT_TESTHASHU64_FNV1A, 8) &&
           VerifyOffset(verifier, VT_TESTARRAYOFBOOLS) &&
           verifier.VerifyVector(testarrayofbools()) &&
           VerifyField<float>(verifier, VT_TESTF, 4) &&
           VerifyField<float>(verifier, VT_TESTF2, 4) &&
           VerifyField<float>(verifier, VT_TESTF3, 4) &&
           VerifyOffset(verifier, VT_TESTARRAYOFSTRING2) &&
           verifier.VerifyVector(testarrayofstring2()) &&
           verifier.VerifyVectorOfStrings(testarrayofstring2()) &&
           VerifyOffset(verifier, VT_TESTARRAYOFSORTEDSTRUCT) &&
           verifier.VerifyVector(testarrayofsortedstruct()) &&
           VerifyOffset(verifier, VT_FLEX) &&
           verifier.VerifyVector(flex()) &&
           flexbuffers::VerifyNestedFlexBuffer(flex(), verifier) &&
           VerifyOffset(verifier, VT_TEST5) &&
           verifier.VerifyVector(test5()) &&
           VerifyOffset(verifier, VT_VECTOR_OF_LONGS) &&
           verifier.VerifyVector(vector_of_longs()) &&
           VerifyOffset(verifier, VT_VECTOR_OF_DOUBLES) &&
           verifier.VerifyVector(vector_of_doubles()) &&
           VerifyOffset(verifier, VT_PARENT_NAMESPACE_TEST) &&
           verifier.VerifyTable(parent_namespace_test()) &&
           VerifyOffset(verifier, VT_VECTOR_OF_REFERRABLES) &&
           verifier.VerifyVector(vector_of_referrables()) &&
           verifier.VerifyVectorOfTables(vector_of_referrables()) &&
           VerifyField<uint64_t>(verifier, VT_SINGLE_WEAK_REFERENCE, 8) &&
           VerifyOffset(verifier, VT_VECTOR_OF_WEAK_REFERENCES) &&
           verifier.VerifyVector(vector_of_weak_references()) &&
           VerifyOffset(verifier, VT_VECTOR_OF_STRONG_REFERRABLES) &&
           verifier.VerifyVector(vector_of_strong_referrables()) &&
           verifier.VerifyVectorOfTables(vector_of_strong_referrables()) &&
           VerifyField<uint64_t>(verifier, VT_CO_OWNING_REFERENCE, 8) &&
           VerifyOffset(verifier, VT_VECTOR_OF_CO_OWNING_REFERENCES) &&
           verifier.VerifyVector(vector_of_co_owning_references()) &&
           VerifyField<uint64_t>(verifier, VT_NON_OWNING_REFERENCE, 8) &&
           VerifyOffset(verifier, VT_VECTOR_OF_NON_OWNING_REFERENCES) &&
           verifier.VerifyVector(vector_of_non_owning_references()) &&
           VerifyField<uint8_t>(verifier, VT_ANY_UNIQUE_TYPE, 1) &&
           VerifyOffset(verifier, VT_ANY_UNIQUE) &&
           VerifyAnyUniqueAliases(verifier, any_unique(), any_unique_type()) &&
           VerifyField<uint8_t>(verifier, VT_ANY_AMBIGUOUS_TYPE, 1) &&
           VerifyOffset(verifier, VT_ANY_AMBIGUOUS) &&
           VerifyAnyAmbiguousAliases(verifier, any_ambiguous(), any_ambiguous_type()) &&
           VerifyOffset(verifier, VT_VECTOR_OF_ENUMS) &&
           verifier.VerifyVector(vector_of_enums()) &&
           VerifyField<int8_t>(verifier, VT_SIGNED_ENUM, 1) &&
           VerifyOffset(verifier, VT_TESTREQUIREDNESTEDFLATBUFFER) &&
           verifier.VerifyVector(testrequirednestedflatbuffer()) &&
           verifier.VerifyNestedFlatBuffer<MyGame::Example::Monster>(testrequirednestedflatbuffer(), nullptr) &&
           VerifyOffset(verifier, VT_SCALAR_KEY_SORTED_TABLES) &&
           verifier.VerifyVector(scalar_key_sorted_tables()) &&
           verifier.VerifyVectorOfTables(scalar_key_sorted_tables()) &&
           VerifyField<MyGame::Example::Test>(verifier, VT_NATIVE_INLINE, 2) &&
           VerifyField<uint64_t>(verifier, VT_LONG_ENUM_NON_ENUM_DEFAULT, 8) &&
           VerifyField<uint64_t>(verifier, VT_LONG_ENUM_NORMAL_DEFAULT, 8) &&
           VerifyField<float>(verifier, VT_NAN_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_INF_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_POSITIVE_INF_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_INFINITY_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_POSITIVE_INFINITY_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_NEGATIVE_INF_DEFAULT, 4) &&
           VerifyField<float>(verifier, VT_NEGATIVE_INFINITY_DEFAULT, 4) &&
           VerifyField<double>(verifier, VT_DOUBLE_INF_DEFAULT, 8) &&
           verifier.EndTable();
  }